

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O1

void __thiscall asmjit::ZoneHeap::_releaseDynamic(ZoneHeap *this,void *p,size_t size)

{
  Zone *pZVar1;
  DynamicBlock *pDVar2;
  Block *pBVar3;
  char cVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  sbyte sVar8;
  Error EVar9;
  DynamicBlock **ppDVar11;
  Slot *pSVar12;
  sbyte sVar13;
  ZoneHeap *in_RCX;
  ZoneHeap *pZVar14;
  ZoneHeap *pZVar15;
  Block *pBVar16;
  Block *newLength;
  DynamicBlock **ppDVar17;
  ulong extraout_RDX;
  Slot *extraout_RDX_00;
  ZoneHeap *sizeOfT;
  ZoneHeap *extraout_RDX_01;
  Slot *pSVar18;
  ulong *puVar19;
  ulong extraout_RDX_02;
  ZoneHeap *extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  ZoneHeap *unaff_RBX;
  ZoneHeap *unaff_RBP;
  ZoneHeap *pZVar20;
  uint uVar21;
  ZoneHeap *pZVar22;
  ZoneHeap *pZVar23;
  ZoneHeap *pZVar24;
  ZoneHeap *pZVar25;
  ulong in_R8;
  ulong uVar26;
  undefined1 *puVar27;
  undefined1 *puVar28;
  ulong uVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  ZoneHeap *pZVar33;
  Slot *pSVar34;
  ZoneHeap *pZVar35;
  uint8_t *puVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  size_t sStack_128;
  ZoneHeap *pZStack_120;
  ZoneHeap *pZStack_118;
  ZoneHeap *pZStack_110;
  ZoneHeap *pZStack_100;
  size_t sStack_f8;
  ZoneHeap *pZStack_f0;
  ZoneHeap *pZStack_e8;
  ZoneHeap *pZStack_e0;
  ZoneHeap *pZStack_d8;
  undefined8 uStack_d0;
  code *pcStack_c8;
  uint uStack_bc;
  ZoneHeap *pZStack_b8;
  ZoneHeap *pZStack_b0;
  ZoneHeap *pZStack_a8;
  ZoneHeap *pZStack_a0;
  ZoneHeap *pZStack_98;
  ZoneHeap *pZStack_90;
  ZoneHeap *pZStack_80;
  ZoneHeap *pZStack_70;
  ZoneHeap *pZStack_68;
  ZoneHeap *pZStack_60;
  code *pcStack_58;
  ZoneHeap *pZStack_48;
  ulong uStack_40;
  uint uVar10;
  
  if (this->_zone == (Zone *)0x0) {
    _releaseDynamic();
  }
  else {
    pZVar33 = *(ZoneHeap **)((long)p + -8);
    ppDVar11 = &this->_dynamicBlocks;
    ppDVar17 = ppDVar11;
    do {
      in_RCX = (ZoneHeap *)*ppDVar17;
      if (in_RCX == pZVar33) break;
      ppDVar17 = (DynamicBlock **)in_RCX->_slots;
    } while (in_RCX != (ZoneHeap *)0x0);
    this = pZVar33;
    if (in_RCX != (ZoneHeap *)0x0) {
      pZVar1 = pZVar33->_zone;
      pDVar2 = (DynamicBlock *)pZVar33->_slots[0];
      ppDVar17 = (DynamicBlock **)&pZVar1->_end;
      if (pZVar1 == (Zone *)0x0) {
        ppDVar17 = ppDVar11;
      }
      *ppDVar17 = pDVar2;
      if (pDVar2 != (DynamicBlock *)0x0) {
        pDVar2->prev = (DynamicBlock *)pZVar1;
      }
      free(pZVar33);
      return;
    }
  }
  _releaseDynamic();
  pZVar33 = (ZoneHeap *)this->_slots[1];
  pZVar14 = (ZoneHeap *)0x0;
  if (in_RCX <= pZVar33) {
    return;
  }
  pZVar22 = (ZoneHeap *)((long)in_RCX * extraout_RDX);
  if (pZVar22 < in_RCX) {
    return;
  }
  if (((ZoneHeap *)p)->_zone == (Zone *)0x0) {
    pcStack_58 = (code *)0x11956b;
    ZoneVectorBase::_reserve();
    pZVar25 = this;
LAB_0011956b:
    pcStack_58 = (code *)0x119570;
    ZoneVectorBase::_reserve();
LAB_00119570:
    pcStack_58 = (code *)0x119575;
    ZoneVectorBase::_reserve();
  }
  else {
    pcStack_58 = (code *)0x11947f;
    pZVar25 = (ZoneHeap *)p;
    unaff_RBP = (ZoneHeap *)_alloc((ZoneHeap *)p,(size_t)pZVar22,&uStack_40);
    if (unaff_RBP == (ZoneHeap *)0x0) {
      return;
    }
    pZVar22 = (ZoneHeap *)this->_zone;
    pSVar18 = this->_slots[0];
    if (pSVar18 != (Slot *)0x0) {
      pcStack_58 = (code *)0x1194ae;
      pZVar25 = unaff_RBP;
      pZStack_48 = (ZoneHeap *)p;
      memcpy(unaff_RBP,pZVar22,(long)pSVar18 * extraout_RDX);
      pSVar18 = extraout_RDX_00;
      p = pZStack_48;
    }
    unaff_RBX = this;
    if (pZVar22 == (ZoneHeap *)0x0) {
LAB_00119536:
      pZVar14 = (ZoneHeap *)0x0;
      this->_slots[1] = (Slot *)(uStack_40 / extraout_RDX);
      if (in_RCX <= (ZoneHeap *)(uStack_40 / extraout_RDX)) {
        this->_zone = (Zone *)unaff_RBP;
        return;
      }
      goto LAB_0011956b;
    }
    if (((ZoneHeap *)p)->_zone == (Zone *)0x0) goto LAB_00119570;
    pZVar33 = (ZoneHeap *)((long)pZVar33 * extraout_RDX);
    if (pZVar33 != (ZoneHeap *)0x0) {
      if (pZVar33 < (ZoneHeap *)0x201) {
        if (pZVar33 < (ZoneHeap *)0x81) {
          uVar10 = (uint)((ulong)((long)pZVar33[0x55555555]._slots + 0x17U) >> 5);
        }
        else {
          uVar10 = (int)((ulong)((long)pZVar33[0xaaaaaaa9]._slots + 0x17U) >> 6) + 4;
        }
      }
      else {
        uVar10 = 0;
      }
      if (pZVar33 < (ZoneHeap *)0x201) {
        pZVar22->_zone = (Zone *)((ZoneHeap *)p)->_slots[uVar10];
        ((ZoneHeap *)p)->_slots[uVar10] = (Slot *)pZVar22;
      }
      else {
        pcStack_58 = (code *)0x119536;
        pZVar25 = (ZoneHeap *)p;
        _releaseDynamic((ZoneHeap *)p,pZVar22,(size_t)pSVar18);
      }
      goto LAB_00119536;
    }
  }
  pcStack_58 = ZoneVectorBase::_resize;
  ZoneVectorBase::_reserve();
  pZVar23 = (ZoneHeap *)pZVar25->_slots[0];
  pZStack_70 = unaff_RBX;
  pZStack_68 = (ZoneHeap *)p;
  pZStack_60 = in_RCX;
  if (pZVar14 <= (ZoneHeap *)pZVar25->_slots[1]) {
LAB_00119595:
    if (pZVar23 <= pZVar14 && (long)pZVar14 - (long)pZVar23 != 0) {
      pZStack_80 = (ZoneHeap *)0x1195b2;
      memset((uint8_t **)((long)&pZVar25->_zone->_ptr + (long)pZVar23 * (long)sizeOfT),0,
             ((long)pZVar14 - (long)pZVar23) * (long)sizeOfT);
    }
    pZVar25->_slots[0] = (Slot *)pZVar14;
    return;
  }
  pZVar15 = (ZoneHeap *)((long)pZVar14 - (long)pZVar23);
  pZStack_80 = (ZoneHeap *)0x1195d5;
  pZVar24 = pZVar25;
  EVar9 = ZoneVectorBase::_grow((ZoneVectorBase *)pZVar25,pZVar22,(size_t)sizeOfT,(size_t)pZVar15);
  if (EVar9 != 0) {
    return;
  }
  if (pZVar14 <= (ZoneHeap *)pZVar25->_slots[1]) goto LAB_00119595;
  pZStack_80 = (ZoneHeap *)ZoneBitVector::_resize;
  ZoneVectorBase::_resize();
  pZVar35 = sizeOfT;
  pZStack_a8 = pZVar14;
  pZStack_a0 = pZVar23;
  pZStack_98 = pZVar33;
  pZStack_90 = pZVar25;
  pZStack_80 = unaff_RBP;
  if (pZVar15 < extraout_RDX_01) {
    pcStack_c8 = (code *)0x119874;
    ZoneBitVector::_resize();
    pZVar20 = unaff_RBP;
    pZVar24 = pZVar25;
LAB_00119874:
    bVar5 = false;
LAB_001196c3:
    if (!bVar5) {
      return;
    }
LAB_001196d0:
    pZVar22 = pZVar23;
    pZVar23 = (ZoneHeap *)((ulong)pZVar20 >> 6);
    uVar10 = (uint)pZVar14 & 0x3f;
    sVar8 = (sbyte)uVar10;
    pSVar18 = (Slot *)-(in_R8 & 0xff);
    pZVar20 = (ZoneHeap *)((ulong)pZVar20 & 0x3f);
    if (pZVar20 != (ZoneHeap *)0x0) {
      pZVar25 = (ZoneHeap *)((ulong)pZVar14 >> 6);
      sVar13 = 0;
      if ((pZVar23 == pZVar25) && (sVar13 = sVar8, uVar10 <= (uint)pZVar20)) {
        pcStack_c8 = (code *)0x11989e;
        ZoneBitVector::_resize();
LAB_0011989e:
        pcStack_c8 = (code *)0x1198a3;
        ZoneBitVector::_resize();
        goto LAB_001198a3;
      }
      pZVar33->_slots[(long)((long)&pZVar23[-1]._dynamicBlocks + 7)] =
           (Slot *)((ulong)pZVar33->_slots[(long)((long)&pZVar23[-1]._dynamicBlocks + 7)] |
                   (long)pSVar18 << (sVar13 - (char)pZVar20 & 0x3fU));
      pZVar23 = (ZoneHeap *)((long)&pZVar23->_zone + 1);
    }
    auVar7 = _DAT_00135a50;
    auVar6 = _DAT_00135a40;
    uVar26 = (ulong)(pZVar14->_slots + 7) >> 6;
    lVar30 = uVar26 - 1;
    uVar29 = (ulong)((ZoneHeap *)(lVar30 * 0x40) == pZVar14);
    pZVar22 = (ZoneHeap *)(lVar30 - uVar29);
    if (pZVar23 <= pZVar22) {
      puVar27 = (undefined1 *)(uVar26 - uVar29);
      puVar28 = (undefined1 *)((long)&pZVar23->_zone + 1);
      if (puVar27 <= puVar28) {
        puVar27 = puVar28;
      }
      puVar28 = puVar27 + (-1 - (long)pZVar23);
      auVar37._8_4_ = (int)puVar28;
      auVar37._0_8_ = puVar28;
      auVar37._12_4_ = (int)((ulong)puVar28 >> 0x20);
      uVar29 = 0;
      auVar37 = auVar37 ^ _DAT_00135a50;
      do {
        auVar39._8_4_ = (int)uVar29;
        auVar39._0_8_ = uVar29;
        auVar39._12_4_ = (int)(uVar29 >> 0x20);
        auVar39 = (auVar39 | auVar6) ^ auVar7;
        if ((bool)(~(auVar39._4_4_ == auVar37._4_4_ && auVar37._0_4_ < auVar39._0_4_ ||
                    auVar37._4_4_ < auVar39._4_4_) & 1)) {
          pZVar33->_slots[(long)pZVar23->_slots + (uVar29 - 9)] = pSVar18;
        }
        if ((auVar39._12_4_ != auVar37._12_4_ || auVar39._8_4_ <= auVar37._8_4_) &&
            auVar39._12_4_ <= auVar37._12_4_) {
          pZVar33->_slots[(long)pZVar23->_slots + (uVar29 - 8)] = pSVar18;
        }
        uVar29 = uVar29 + 2;
      } while (((ulong)(puVar27 + (1 - (long)pZVar23)) & 0xfffffffffffffffe) != uVar29);
    }
    if (((ulong)pZVar14 & 0x3f) == 0) goto LAB_00119827;
    puVar19 = (ulong *)((long)pZVar22 * 8 + (long)pZVar33);
  }
  else {
    pZVar20 = (ZoneHeap *)pZVar24->_slots[0];
    pZVar14 = extraout_RDX_01;
    if (pZVar20 < extraout_RDX_01) {
      pZVar33 = (ZoneHeap *)pZVar24->_zone;
      if (extraout_RDX_01 <= (ZoneHeap *)pZVar24->_slots[1]) goto LAB_001196d0;
      pZVar35 = (ZoneHeap *)((ulong)((long)pZVar15->_slots + 0x37) & 0xffffffffffffffc0);
      if (pZVar35 < extraout_RDX_01) goto LAB_00119874;
      if (pZVar22->_zone == (Zone *)0x0) {
        pcStack_c8 = (code *)0x119880;
        ZoneBitVector::_resize();
LAB_00119880:
        bVar5 = false;
        in_R8 = (ulong)uStack_bc;
        pZVar23 = pZVar22;
        pZVar33 = pZStack_b8;
        goto LAB_001196c3;
      }
      uStack_bc = (uint)in_R8;
      pZVar23 = (ZoneHeap *)((ulong)pZVar35 >> 3);
      pcStack_c8 = (code *)0x11965a;
      pZVar25 = pZVar22;
      pZStack_b8 = pZVar33;
      pZVar33 = (ZoneHeap *)_alloc(pZVar22,(size_t)pZVar23,(size_t *)&pZStack_b0);
      if (pZVar33 == (ZoneHeap *)0x0) goto LAB_00119880;
      pZVar15 = (ZoneHeap *)((long)pZStack_b0 * 8);
      if ((ZoneHeap *)((long)pZStack_b0 * 8) < pZStack_b0) {
        pZVar15 = pZVar35;
      }
      if (pZVar20 != (ZoneHeap *)0x0) {
        pcStack_c8 = (code *)0x1196a4;
        pZVar23 = pZStack_b8;
        pZVar25 = pZVar33;
        memcpy(pZVar33,pZStack_b8,((ulong)(pZVar20->_slots + 7) >> 6) - 1);
        pZVar35 = pZVar15;
      }
      if (pZStack_b8 == (ZoneHeap *)0x0) {
LAB_001196ba:
        in_R8 = (ulong)uStack_bc;
        pZVar24->_zone = (Zone *)pZVar33;
        pZVar24->_slots[1] = (Slot *)pZVar15;
        bVar5 = true;
        pZVar23 = pZVar22;
        goto LAB_001196c3;
      }
      if (pZVar22->_zone == (Zone *)0x0) goto LAB_0011989e;
      pZVar25 = (ZoneHeap *)pZVar24->_slots[1];
      if ((ZoneHeap *)0x7 < pZVar25) {
        pcStack_c8 = (code *)0x119862;
        ZoneBitVector::_resize();
        pZVar35 = pZVar15;
        goto LAB_001196ba;
      }
LAB_001198a3:
      pcStack_c8 = ZoneBitVector::_append;
      ZoneBitVector::_resize();
      pBVar3 = (Block *)pZVar25->_slots[1];
      pBVar16 = (Block *)0x80;
      if ((Block *)0x7f < pBVar3) {
        if (pBVar3 < (Block *)0x4000001) {
          pBVar16 = (Block *)((long)pBVar3 * 2);
        }
        else {
          pBVar16 = pBVar3 + 0x200000;
        }
      }
      newLength = (Block *)((long)&pZVar25->_slots[0]->next + 1);
      if ((pBVar3 <= pBVar16) || (pBVar16 = newLength, pBVar3 < newLength)) {
        ZoneBitVector::_resize
                  ((ZoneBitVector *)pZVar25,pZVar23,(size_t)newLength,(size_t)pBVar16,
                   SUB81(extraout_RDX_02 & 0xffffffff,0));
        return;
      }
      uStack_d0 = 0x1198f5;
      pcStack_c8 = (code *)(extraout_RDX_02 & 0xffffffff);
      ZoneBitVector::_append();
      if (extraout_RDX_03 <= pZVar23) {
        return;
      }
      if ((ZoneHeap *)pZVar25->_slots[0] < pZVar23) {
        pZStack_d8 = (ZoneHeap *)0x119a81;
        ZoneBitVector::fill();
LAB_00119a81:
        pZStack_d8 = (ZoneHeap *)0x119a86;
        ZoneBitVector::fill();
LAB_00119a86:
        pZStack_d8 = (ZoneHeap *)0x119a8b;
        ZoneBitVector::fill();
      }
      else {
        if ((ZoneHeap *)pZVar25->_slots[0] < extraout_RDX_03) goto LAB_00119a81;
        pZVar25 = (ZoneHeap *)pZVar25->_zone;
        if (pZVar25 == (ZoneHeap *)0x0) goto LAB_00119a86;
        cVar4 = (char)newLength;
        uVar29 = (ulong)pZVar23 >> 6;
        uVar21 = (uint)pZVar23 & 0x3f;
        pZVar23 = (ZoneHeap *)(ulong)uVar21;
        uVar26 = (ulong)extraout_RDX_03 >> 6;
        uVar10 = (uint)extraout_RDX_03 & 0x3f;
        sVar8 = (sbyte)uVar10;
        if (pZVar23 == (ZoneHeap *)0x0) {
LAB_00119994:
          auVar7 = _DAT_00135a50;
          auVar6 = _DAT_00135a40;
          lVar30 = uVar26 - uVar29;
          if (uVar29 <= uVar26 && lVar30 != 0) {
            lVar31 = lVar30 + -1;
            auVar38._8_4_ = (int)lVar31;
            auVar38._0_8_ = lVar31;
            auVar38._12_4_ = (int)((ulong)lVar31 >> 0x20);
            uVar32 = 0;
            auVar38 = auVar38 ^ _DAT_00135a50;
            do {
              auVar40._8_4_ = (int)uVar32;
              auVar40._0_8_ = uVar32;
              auVar40._12_4_ = (int)(uVar32 >> 0x20);
              auVar37 = (auVar40 | auVar6) ^ auVar7;
              if ((bool)(~(auVar37._4_4_ == auVar38._4_4_ && auVar38._0_4_ < auVar37._0_4_ ||
                          auVar38._4_4_ < auVar37._4_4_) & 1)) {
                pZVar25->_slots[uVar29 + (uVar32 - 1)] = (Slot *)-((ulong)newLength & 0xff);
              }
              if ((auVar37._12_4_ != auVar38._12_4_ || auVar37._8_4_ <= auVar38._8_4_) &&
                  auVar37._12_4_ <= auVar38._12_4_) {
                pZVar25->_slots[uVar29 + uVar32] = (Slot *)-((ulong)newLength & 0xff);
              }
              uVar32 = uVar32 + 2;
            } while ((lVar30 + 1U & 0xfffffffffffffffe) != uVar32);
          }
          if (((ulong)extraout_RDX_03 & 0x3f) != 0) {
            uVar29 = -1L << sVar8;
            if (cVar4 == '\0') {
              pZVar25->_slots[uVar26 - 1] = (Slot *)((ulong)pZVar25->_slots[uVar26 - 1] & uVar29);
            }
            else {
              pZVar25->_slots[uVar26 - 1] = (Slot *)((ulong)pZVar25->_slots[uVar26 - 1] | ~uVar29);
            }
          }
          return;
        }
        sVar13 = (sbyte)uVar21;
        if (uVar29 != uVar26) {
          if (cVar4 == '\0') {
            pZVar25->_slots[uVar29 - 1] =
                 (Slot *)((ulong)pZVar25->_slots[uVar29 - 1] & ~(-1L << sVar13));
          }
          else {
            pZVar25->_slots[uVar29 - 1] =
                 (Slot *)((ulong)pZVar25->_slots[uVar29 - 1] | -1L << sVar13);
          }
          uVar29 = uVar29 + 1;
          goto LAB_00119994;
        }
        if (uVar21 < uVar10) {
          uVar26 = ~(-1L << (sVar8 - sVar13 & 0x3fU)) << sVar13;
          if (cVar4 != '\0') {
            pZVar25->_slots[uVar29 - 1] = (Slot *)((ulong)pZVar25->_slots[uVar29 - 1] | uVar26);
            return;
          }
          pZVar25->_slots[uVar29 - 1] = (Slot *)((ulong)pZVar25->_slots[uVar29 - 1] & ~uVar26);
          return;
        }
      }
      pZStack_d8 = (ZoneHeap *)ZoneStackBase::_init;
      ZoneBitVector::fill();
      pZVar1 = pZVar25->_zone;
      pZStack_f0 = pZVar14;
      pZStack_e8 = pZVar24;
      pZStack_e0 = pZVar35;
      pZStack_d8 = pZVar20;
      if (pZVar1 != (Zone *)0x0) {
        if ((Block *)pZVar25->_slots[0] != (Block *)0x0) {
          pBVar16 = (Block *)pZVar25->_slots[0];
          if (pZVar1->_ptr == (uint8_t *)0x0) {
            pZStack_100 = (ZoneHeap *)ZoneStackBase::_prepareBlock;
            pZVar14 = pZVar23;
            pZVar24 = pZVar25;
            ZoneStackBase::_init();
            pZVar33 = (ZoneHeap *)pZVar24->_zone;
            pZStack_120 = pZVar25;
            pZStack_118 = pZVar22;
            pZStack_110 = pZVar23;
            pZStack_100 = pZVar20;
            if (pZVar33 == (ZoneHeap *)0x0) {
              ZoneStackBase::_prepareBlock();
            }
            else {
              uVar29 = (ulong)pZVar14 & 0xffffffff;
              pSVar18 = pZVar24->_slots[uVar29];
              if (pSVar18[2].next != pSVar18[3].next) {
                if (pZVar33->_zone != (Zone *)0x0) {
                  pSVar12 = (Slot *)_alloc(pZVar33,0x200,&sStack_128);
                  if (pSVar12 == (Slot *)0x0) {
                    return;
                  }
                  pSVar12[uVar29].next = (Slot *)0x0;
                  pSVar12[(int)pZVar14 == 0].next = pSVar18;
                  pSVar34 = (Slot *)((long)&pSVar12->next + extraout_RDX_05);
                  pSVar12[2].next = pSVar34;
                  pSVar12[3].next = pSVar34;
                  pSVar18[uVar29].next = pSVar12;
                  pZVar24->_slots[uVar29] = pSVar12;
                  return;
                }
                goto LAB_00119bc2;
              }
            }
            ZoneStackBase::_prepareBlock();
LAB_00119bc2:
            ZoneStackBase::_prepareBlock();
            return;
          }
          do {
            pBVar3 = pBVar16->next;
            pBVar16->prev = pZVar1[2]._block;
            pZVar1[2]._block = pBVar16;
            pBVar16 = pBVar3;
          } while (pBVar3 != (Block *)0x0);
        }
        pZVar25->_zone = (Zone *)0x0;
        pZVar25->_slots[0] = (Slot *)0x0;
        pZVar25->_slots[1] = (Slot *)0x0;
      }
      if (pZVar23 != (ZoneHeap *)0x0) {
        if (pZVar23->_zone == (Zone *)0x0) {
          pZStack_100 = (ZoneHeap *)0x119b2c;
          ZoneStackBase::_init();
        }
        else {
          pZStack_100 = (ZoneHeap *)0x119af9;
          pBVar16 = (Block *)_alloc(pZVar23,0x200,&sStack_f8);
          if (pBVar16 != (Block *)0x0) {
            puVar36 = (uint8_t *)((long)&pBVar16->prev + extraout_RDX_04);
            pBVar16->prev = (Block *)0x0;
            pBVar16->next = (Block *)0x0;
            pBVar16->size = (size_t)puVar36;
            *(uint8_t **)pBVar16->data = puVar36;
            pZVar25->_zone = (Zone *)pZVar23;
            pZVar25->_slots[0] = (Slot *)pBVar16;
            pZVar25->_slots[1] = (Slot *)pBVar16;
          }
        }
      }
      return;
    }
    sVar8 = (sbyte)((ulong)extraout_RDX_01 & 0x3f);
    if (((ulong)extraout_RDX_01 & 0x3f) == 0) goto LAB_00119827;
    puVar19 = (ulong *)((long)&pZVar24->_zone->_ptr +
                       ((ulong)extraout_RDX_01 >> 3 & 0xfffffffffffffff8));
  }
  *puVar19 = *puVar19 & ~(-1L << sVar8);
LAB_00119827:
  pZVar24->_slots[0] = (Slot *)pZVar14;
  return;
}

Assistant:

void ZoneHeap::_releaseDynamic(void* p, size_t size) noexcept {
  ASMJIT_ASSERT(isInitialized());
  //printf("RELEASING DYNAMIC %p of size %d\n", p, int(size));

  // Pointer to `DynamicBlock` is stored at [-1].
  DynamicBlock* block = reinterpret_cast<DynamicBlock**>(p)[-1];
  ASMJIT_ASSERT(ZoneHeap_hasDynamicBlock(this, block));

  // Unlink and free.
  DynamicBlock* prev = block->prev;
  DynamicBlock* next = block->next;

  if (prev)
    prev->next = next;
  else
    _dynamicBlocks = next;

  if (next)
    next->prev = prev;

  Internal::releaseMemory(block);
}